

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegAtomPtr xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom)

{
  xmlRegStatePtr *ppxVar1;
  xmlRegStatePtr pxVar2;
  int local_2c;
  int i;
  xmlRegAtomPtr ret;
  xmlRegAtomPtr atom_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlRegParserCtxtPtr)(*xmlMalloc)(0x60);
  if (ctxt_local == (xmlRegParserCtxtPtr)0x0) {
    xmlRegexpErrMemory(ctxt,"copying atom");
    ctxt_local = (xmlRegParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0x60);
    *(xmlRegAtomType *)((long)&ctxt_local->string + 4) = atom->type;
    *(xmlRegQuantType *)&ctxt_local->cur = atom->quant;
    *(int *)((long)&ctxt_local->cur + 4) = atom->min;
    ctxt_local->error = atom->max;
    if (0 < atom->nbRanges) {
      ppxVar1 = (xmlRegStatePtr *)(*xmlMalloc)((long)atom->nbRanges << 3);
      ctxt_local->states = ppxVar1;
      if (ctxt_local->states == (xmlRegStatePtr *)0x0) {
        xmlRegexpErrMemory(ctxt,"copying atom");
LAB_002044c4:
        xmlRegFreeAtom((xmlRegAtomPtr)ctxt_local);
        ctxt_local = (xmlRegParserCtxtPtr)0x0;
      }
      else {
        for (local_2c = 0; local_2c < atom->nbRanges; local_2c = local_2c + 1) {
          pxVar2 = (xmlRegStatePtr)xmlRegCopyRange(ctxt,atom->ranges[local_2c]);
          ctxt_local->states[local_2c] = pxVar2;
          if (ctxt_local->states[local_2c] == (xmlRegStatePtr)0x0) goto LAB_002044c4;
          ctxt_local->nbStates = local_2c + 1;
        }
      }
    }
  }
  return (xmlRegAtomPtr)ctxt_local;
}

Assistant:

static xmlRegAtomPtr
xmlRegCopyAtom(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom) {
    xmlRegAtomPtr ret;

    ret = (xmlRegAtomPtr) xmlMalloc(sizeof(xmlRegAtom));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt, "copying atom");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegAtom));
    ret->type = atom->type;
    ret->quant = atom->quant;
    ret->min = atom->min;
    ret->max = atom->max;
    if (atom->nbRanges > 0) {
        int i;

        ret->ranges = (xmlRegRangePtr *) xmlMalloc(sizeof(xmlRegRangePtr) *
	                                           atom->nbRanges);
	if (ret->ranges == NULL) {
	    xmlRegexpErrMemory(ctxt, "copying atom");
	    goto error;
	}
	for (i = 0;i < atom->nbRanges;i++) {
	    ret->ranges[i] = xmlRegCopyRange(ctxt, atom->ranges[i]);
	    if (ret->ranges[i] == NULL)
	        goto error;
	    ret->nbRanges = i + 1;
	}
    }
    return(ret);

error:
    xmlRegFreeAtom(ret);
    return(NULL);
}